

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O0

bool __thiscall
QToolBarAreaLayout::restoreState
          (QToolBarAreaLayout *this,QDataStream *stream,QList<QToolBar_*> *_toolBars,uchar tmarker,
          bool testing)

{
  byte bVar1;
  int iVar2;
  Status SVar3;
  QToolBarPrivate *this_00;
  qsizetype qVar4;
  QWidgetPrivate *pQVar5;
  char in_CL;
  long lVar6;
  QDataStream *in_RSI;
  long in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  QWidgetPrivate *toolBarPrivate;
  int x;
  QToolBar *toolBar;
  uint geom1;
  uint geom0;
  int k;
  bool applyingLayout;
  QToolBarAreaLayoutInfo *dock;
  int j;
  bool floating;
  QRect rect;
  uchar shown;
  QString objectName;
  QToolBarAreaLayoutLine line;
  int cnt;
  int pos;
  int lines;
  QList<QToolBar_*> toolBars;
  QToolBarAreaLayoutItem item;
  undefined4 in_stack_fffffffffffffe98;
  Orientation in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  QLayoutItem *in_stack_fffffffffffffea8;
  QRect *in_stack_fffffffffffffeb0;
  uint in_stack_fffffffffffffeb8;
  undefined2 in_stack_fffffffffffffebc;
  undefined1 in_stack_fffffffffffffebe;
  byte in_stack_fffffffffffffebf;
  int local_124;
  QRect *local_120;
  int local_110;
  int local_f8;
  bool local_d1;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 local_78 [52];
  int local_44;
  int local_40;
  int local_3c;
  QList<QToolBar_*> local_38;
  undefined1 local_20 [12];
  int iStack_14;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (QToolBar **)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QToolBar_*>::QList
            ((QList<QToolBar_*> *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             (QList<QToolBar_*> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
  local_3c = -0x55555556;
  QDataStream::operator>>(in_RSI,&local_3c);
  local_f8 = 0;
  do {
    if (local_3c <= local_f8) {
      SVar3 = QDataStream::status(in_RSI);
      local_d1 = SVar3 == Ok;
LAB_006f613b:
      QList<QToolBar_*>::~QList((QList<QToolBar_*> *)0x6f6148);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_d1;
      }
      __stack_chk_fail();
    }
    local_40 = -0x55555556;
    QDataStream::operator>>(in_RSI,&local_40);
    if ((local_40 < 0) || (3 < local_40)) {
      local_d1 = false;
      goto LAB_006f613b;
    }
    local_44 = -0x55555556;
    QDataStream::operator>>(in_RSI,&local_44);
    lVar6 = (long)local_40;
    bVar1 = (in_R8B & 1 ^ 0xff) & 1;
    memset(local_78,0xaa,0x30);
    QToolBarAreaLayoutLine::QToolBarAreaLayoutLine
              ((QToolBarAreaLayoutLine *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
               in_stack_fffffffffffffe9c);
    for (local_110 = 0; local_110 < local_44; local_110 = local_110 + 1) {
      local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      stack0xffffffffffffffe8 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      QToolBarAreaLayoutItem::QToolBarAreaLayoutItem
                ((QToolBarAreaLayoutItem *)local_20,(QLayoutItem *)0x0);
      local_90 = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = &DAT_aaaaaaaaaaaaaaaa;
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      QString::QString((QString *)0x6f5dc1);
      ::operator>>(in_RSI,(QString *)&local_90);
      QDataStream::operator>>
                ((QDataStream *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (quint8 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      iVar2 = getInt((QDataStream *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      local_20._8_4_ = iVar2;
      iVar2 = getInt((QDataStream *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      iStack_14 = iVar2;
      QRect::QRect((QRect *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      getInt((QDataStream *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
      if (in_CL == -4) {
        getInt((QDataStream *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
        unpackRect(CONCAT13(in_stack_fffffffffffffebf,
                            CONCAT12(in_stack_fffffffffffffebe,in_stack_fffffffffffffebc)),
                   in_stack_fffffffffffffeb8,(bool *)in_stack_fffffffffffffeb0);
      }
      local_120 = (QRect *)0x0;
      local_124 = 0;
      while( true ) {
        this_00 = (QToolBarPrivate *)(long)local_124;
        qVar4 = QList<QToolBar_*>::size(&local_38);
        if (qVar4 <= (long)this_00) break;
        QList<QToolBar_*>::at
                  ((QList<QToolBar_*> *)
                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        QObject::objectName();
        in_stack_fffffffffffffebf =
             ::operator==((QString *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                          (QString *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        QString::~QString((QString *)0x6f5f4e);
        if ((in_stack_fffffffffffffebf & 1) != 0) {
          local_120 = (QRect *)QList<QToolBar_*>::takeAt
                                         ((QList<QToolBar_*> *)in_stack_fffffffffffffeb0,
                                          (qsizetype)in_stack_fffffffffffffea8);
          break;
        }
        local_124 = local_124 + 1;
      }
      if ((local_120 != (QRect *)0x0) && (bVar1 != 0)) {
        pQVar5 = QWidgetPrivate::get((QWidget *)0x6f5fad);
        pQVar5->widgetItem = (QWidgetItemV2 *)0x0;
        in_stack_fffffffffffffea8 = (QLayoutItem *)operator_new(0x58);
        QWidgetItemV2::QWidgetItemV2
                  ((QWidgetItemV2 *)this_00,
                   (QWidget *)
                   CONCAT17(in_stack_fffffffffffffebf,
                            CONCAT16(in_stack_fffffffffffffebe,
                                     CONCAT24(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)))
                  );
        in_stack_fffffffffffffea4 = *(undefined4 *)(in_RDI + lVar6 * 0x38 + 0x40);
        in_stack_fffffffffffffeb0 = local_120;
        local_20._0_8_ = in_stack_fffffffffffffea8;
        QToolBar::setOrientation
                  ((QToolBar *)local_120,(Orientation)((ulong)in_stack_fffffffffffffea8 >> 0x20));
        (**(code **)(*(long *)local_120 + 0x68))(local_120,0);
        QToolBar::d_func((QToolBar *)0x6f6069);
        QToolBarPrivate::setWindowState
                  (this_00,(bool)in_stack_fffffffffffffebf,(bool)in_stack_fffffffffffffebe,
                   in_stack_fffffffffffffeb0);
        local_10 = (undefined1 *)CONCAT44(local_10._4_4_,iStack_14);
        QList<QToolBarAreaLayoutItem>::append
                  ((QList<QToolBarAreaLayoutItem> *)
                   CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                   (parameter_type)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      }
      QString::~QString((QString *)0x6f60c3);
    }
    if (bVar1 != 0) {
      QList<QToolBarAreaLayoutLine>::append
                ((QList<QToolBarAreaLayoutLine> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (parameter_type)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    QToolBarAreaLayoutLine::~QToolBarAreaLayoutLine((QToolBarAreaLayoutLine *)0x6f6107);
    local_f8 = local_f8 + 1;
  } while( true );
}

Assistant:

bool QToolBarAreaLayout::restoreState(QDataStream &stream, const QList<QToolBar*> &_toolBars, uchar tmarker, bool testing)
{
    QList<QToolBar*> toolBars = _toolBars;
    int lines;
    stream >> lines;

    for (int j = 0; j < lines; ++j) {
        int pos;
        stream >> pos;
        if (pos < 0 || pos >= QInternal::DockCount)
            return false;
        int cnt;
        stream >> cnt;

        QToolBarAreaLayoutInfo &dock = docks[pos];
        const bool applyingLayout = !testing;
        QToolBarAreaLayoutLine line(dock.o);

        for (int k = 0; k < cnt; ++k) {
            QToolBarAreaLayoutItem item;

            QString objectName;
            stream >> objectName;
            uchar shown;
            stream >> shown;
            item.pos = getInt(stream);
            item.size = getInt(stream);

            /*
               4.3.0 added floating toolbars, but failed to add the ability to restore them.
               We need to store there geometry (four ints). We cannot change the format in a
               patch release (4.3.1) by adding ToolBarStateMarkerEx2 to signal extra data. So
               for now we'll pack it in the two legacy ints we no longer used in Qt4.3.0.
               In 4.4, we should add ToolBarStateMarkerEx2 and fix this properly.
            */

            QRect rect;
            bool floating = false;
            uint geom0, geom1;
            geom0 = getInt(stream);
            if (tmarker == ToolBarStateMarkerEx) {
                geom1 = getInt(stream);
                rect = unpackRect(geom0, geom1, &floating);
            }

            QToolBar *toolBar = nullptr;
            for (int x = 0; x < toolBars.size(); ++x) {
                if (toolBars.at(x)->objectName() == objectName) {
                    toolBar = toolBars.takeAt(x);
                    break;
                }
            }
            if (toolBar == nullptr) {
                continue;
            }

            if (applyingLayout) {
                // Clear the previous widgetItem for the toolBar, so that it's
                // assigned correctly in QWidgetItemV2 constructor.
                auto *toolBarPrivate = QWidgetPrivate::get(toolBar);
                toolBarPrivate->widgetItem = nullptr;
                item.widgetItem = new QWidgetItemV2(toolBar);
                toolBar->setOrientation(floating ? ((shown & 2) ? Qt::Vertical : Qt::Horizontal) : dock.o);
                toolBar->setVisible(shown & 1);
                toolBar->d_func()->setWindowState(floating, false, rect);

                item.preferredSize = item.size;
                line.toolBarItems.append(item);
            }
        }

        if (applyingLayout) {
            dock.lines.append(line);
        }
    }


    return stream.status() == QDataStream::Ok;
}